

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O0

bpf_u_int32 ** pcap_nametoaddr(char *name)

{
  uint32_t uVar1;
  hostent *phVar2;
  hostent *hp;
  bpf_u_int32 **p;
  char *name_local;
  
  phVar2 = gethostbyname(name);
  if (phVar2 == (hostent *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    for (hp = (hostent *)phVar2->h_addr_list; hp->h_name != (char *)0x0;
        hp = (hostent *)&hp->h_aliases) {
      uVar1 = ntohl(*(uint32_t *)hp->h_name);
      *(uint32_t *)hp->h_name = uVar1;
    }
    name_local = (char *)phVar2->h_addr_list;
  }
  return (bpf_u_int32 **)name_local;
}

Assistant:

bpf_u_int32 **
pcap_nametoaddr(const char *name)
{
#ifndef h_addr
	static bpf_u_int32 *hlist[2];
#endif
	bpf_u_int32 **p;
	struct hostent *hp;

	if ((hp = gethostbyname(name)) != NULL) {
#ifndef h_addr
		hlist[0] = (bpf_u_int32 *)hp->h_addr;
		NTOHL(hp->h_addr);
		return hlist;
#else
		for (p = (bpf_u_int32 **)hp->h_addr_list; *p; ++p)
			NTOHL(**p);
		return (bpf_u_int32 **)hp->h_addr_list;
#endif
	}
	else
		return 0;
}